

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Accuracy::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  int iVar2;
  uint uVar3;
  Texture2D *this_00;
  ulong uVar4;
  ulong extraout_RAX;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  RGBA local_44;
  Vec4 local_40;
  
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  uVar5 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar5 = this->m_width;
  }
  uVar4 = 0x20;
  if (uVar5 != 0) {
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar4 = (ulong)(uVar3 ^ 0x1f);
  }
  iVar2 = (int)uVar4;
  lVar6 = 0;
  for (uVar7 = 0; 0x20 - iVar2 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = (int)(0xff / (long)(0x1f - iVar2)) * (int)uVar7;
    uVar5 = uVar3;
    if (0xfe < uVar3) {
      uVar5 = 0xff;
    }
    uVar5 = uVar5 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar3 < 0) {
      uVar5 = 0xff00ffff;
    }
    tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,(int)uVar7);
    pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_44.m_value = uVar5;
    tcu::RGBA::toVec(&local_44);
    tcu::clear((PixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),&local_40);
    lVar6 = lVar6 + 0x28;
    uVar4 = extraout_RAX;
  }
  return (int)uVar4;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}